

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O0

size_t menu_dynamic_longest_entry(menu_conflict *m)

{
  size_t sVar1;
  undefined8 *local_28;
  menu_entry *entry;
  size_t current;
  size_t biggest;
  menu_conflict *m_local;
  
  current = 0;
  for (local_28 = (undefined8 *)menu_priv(m); local_28 != (undefined8 *)0x0;
      local_28 = (undefined8 *)local_28[2]) {
    sVar1 = strlen((char *)*local_28);
    if (current < sVar1) {
      current = sVar1;
    }
  }
  return current;
}

Assistant:

size_t menu_dynamic_longest_entry(struct menu *m)
{
	size_t biggest = 0;
	size_t current;

	struct menu_entry *entry;

	for (entry = menu_priv(m); entry; entry = entry->next) {
		current = strlen(entry->text);
		if (current > biggest)
			biggest = current;
	}

	return biggest;
}